

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigListWGL.cpp
# Opt level: O3

void glcts::getConfigListWGL(Platform *param_1,ApiType param_2,ConfigList *param_3)

{
  Exception *this;
  undefined4 in_register_00000034;
  string local_40;
  
  this = (Exception *)__cxa_allocate_exception(0x30,CONCAT44(in_register_00000034,param_2.m_bits));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"WGL is not supported on this OS","");
  tcu::Exception::Exception(this,&local_40);
  __cxa_throw(this,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void getConfigListWGL(tcu::Platform&, glu::ApiType, ConfigList&)
{
	throw tcu::Exception("WGL is not supported on this OS");
}